

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_392279::Marshal<MLKEM768_private_key>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          _func_int_CBB_ptr_MLKEM768_private_key_ptr *marshal_func,MLKEM768_private_key *t)

{
  size_t __first;
  int iVar1;
  cbb_st *pcVar2;
  uchar *__last;
  allocator<unsigned_char> local_6e;
  undefined1 local_6d;
  size_t local_60;
  size_t encoded_len;
  uint8_t *encoded;
  ScopedCBB cbb;
  MLKEM768_private_key *t_local;
  _func_int_CBB_ptr_MLKEM768_private_key_ptr *marshal_func_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  cbb.ctx_.u._24_8_ = t;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&encoded);
  pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&encoded);
  iVar1 = CBB_init(pcVar2,1);
  if (iVar1 != 0) {
    pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&encoded);
    iVar1 = (*marshal_func)(pcVar2,(MLKEM768_private_key *)cbb.ctx_.u._24_8_);
    if (iVar1 != 0) {
      pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&encoded);
      iVar1 = CBB_finish(pcVar2,(uint8_t **)&encoded_len,&local_60);
      __first = encoded_len;
      if (iVar1 != 0) {
        local_6d = 0;
        __last = (uchar *)(encoded_len + local_60);
        std::allocator<unsigned_char>::allocator(&local_6e);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (uchar *)__first,__last,&local_6e);
        std::allocator<unsigned_char>::~allocator(&local_6e);
        OPENSSL_free((void *)encoded_len);
        local_6d = 1;
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&encoded);
        return __return_storage_ptr__;
      }
    }
  }
  abort();
}

Assistant:

std::vector<uint8_t> Marshal(int (*marshal_func)(CBB *, const T *),
                             const T *t) {
  bssl::ScopedCBB cbb;
  uint8_t *encoded;
  size_t encoded_len;
  if (!CBB_init(cbb.get(), 1) ||      //
      !marshal_func(cbb.get(), t) ||  //
      !CBB_finish(cbb.get(), &encoded, &encoded_len)) {
    abort();
  }

  std::vector<uint8_t> ret(encoded, encoded + encoded_len);
  OPENSSL_free(encoded);
  return ret;
}